

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_framebuffer.cpp
# Opt level: O0

void __thiscall
OpenGLFrameBuffer::GetScreenshotBuffer
          (OpenGLFrameBuffer *this,BYTE **buffer,int *pitch,ESSType *color_type)

{
  GLint GVar1;
  GLint GVar2;
  GLsizei GVar3;
  GLsizei GVar4;
  int iVar5;
  int iVar6;
  _func_void_GLint_GLint_GLsizei_GLsizei_GLenum_GLenum_void_ptr *p_Var7;
  int iVar8;
  int iVar9;
  uchar *puVar10;
  BYTE *pBVar11;
  int dindex;
  int sindex;
  int sy;
  int sx;
  float v;
  float u;
  int x;
  int y;
  float rcpHeight;
  float rcpWidth;
  int h;
  int w;
  undefined1 local_40 [8];
  TArray<unsigned_char,_unsigned_char> pixels;
  GL_IRECT *viewport;
  ESSType *color_type_local;
  int *pitch_local;
  BYTE **buffer_local;
  OpenGLFrameBuffer *this_local;
  
  pixels._8_8_ = &GLRenderer->mOutputLetterbox;
  TArray<unsigned_char,_unsigned_char>::TArray((TArray<unsigned_char,_unsigned_char> *)local_40);
  TArray<unsigned_char,_unsigned_char>::Resize
            ((TArray<unsigned_char,_unsigned_char> *)local_40,
             *(int *)(pixels._8_8_ + 8) * *(int *)(pixels._8_8_ + 0xc) * 3);
  (*_ptrc_glPixelStorei)(0xd05,1);
  p_Var7 = _ptrc_glReadPixels;
  GVar1 = *(GLint *)pixels._8_8_;
  GVar2 = *(GLint *)(pixels._8_8_ + 4);
  GVar3 = *(GLsizei *)(pixels._8_8_ + 8);
  GVar4 = *(GLsizei *)(pixels._8_8_ + 0xc);
  puVar10 = TArray<unsigned_char,_unsigned_char>::operator[]
                      ((TArray<unsigned_char,_unsigned_char> *)local_40,0);
  (*p_Var7)(GVar1,GVar2,GVar3,GVar4,0x1907,0x1401,puVar10);
  (*_ptrc_glPixelStorei)(0xd05,4);
  iVar8 = DCanvas::GetWidth((DCanvas *)screen);
  iVar9 = DCanvas::GetHeight((DCanvas *)screen);
  (*(this->super_SDLGLFB).super_DFrameBuffer.super_DSimpleCanvas.super_DCanvas.super_DObject.
    _vptr_DObject[0x17])();
  pBVar11 = (BYTE *)operator_new__((long)(iVar8 * iVar9 * 3));
  this->ScreenshotBuffer = pBVar11;
  for (u = 0.0; (int)u < iVar9; u = (float)((int)u + 1)) {
    for (v = 0.0; (int)v < iVar8; v = (float)((int)v + 1)) {
      iVar5 = ((int)(((float)(int)v + 0.5) * (1.0 / (float)iVar8) *
                    (float)*(int *)(pixels._8_8_ + 8)) +
              (int)(((float)(int)u + 0.5) * (1.0 / (float)iVar9) *
                   (float)*(int *)(pixels._8_8_ + 0xc)) * *(int *)(pixels._8_8_ + 8)) * 3;
      iVar6 = ((int)v + (int)u * iVar8) * 3;
      puVar10 = TArray<unsigned_char,_unsigned_char>::operator[]
                          ((TArray<unsigned_char,_unsigned_char> *)local_40,(long)iVar5);
      this->ScreenshotBuffer[iVar6] = *puVar10;
      puVar10 = TArray<unsigned_char,_unsigned_char>::operator[]
                          ((TArray<unsigned_char,_unsigned_char> *)local_40,(long)(iVar5 + 1));
      this->ScreenshotBuffer[(long)iVar6 + 1] = *puVar10;
      puVar10 = TArray<unsigned_char,_unsigned_char>::operator[]
                          ((TArray<unsigned_char,_unsigned_char> *)local_40,(long)(iVar5 + 2));
      this->ScreenshotBuffer[iVar6 + 2] = *puVar10;
    }
  }
  *pitch = iVar8 * -3;
  *color_type = SS_RGB;
  *buffer = this->ScreenshotBuffer + iVar8 * 3 * (iVar9 + -1);
  TArray<unsigned_char,_unsigned_char>::~TArray((TArray<unsigned_char,_unsigned_char> *)local_40);
  return;
}

Assistant:

void OpenGLFrameBuffer::GetScreenshotBuffer(const BYTE *&buffer, int &pitch, ESSType &color_type)
{
	const auto &viewport = GLRenderer->mOutputLetterbox;

	// Grab what is in the back buffer.
	// We cannot rely on SCREENWIDTH/HEIGHT here because the output may have been scaled.
	TArray<uint8_t> pixels;
	pixels.Resize(viewport.width * viewport.height * 3);
	glPixelStorei(GL_PACK_ALIGNMENT, 1);
	glReadPixels(viewport.left, viewport.top, viewport.width, viewport.height, GL_RGB, GL_UNSIGNED_BYTE, &pixels[0]);
	glPixelStorei(GL_PACK_ALIGNMENT, 4);

	// Copy to screenshot buffer:
	int w = SCREENWIDTH;
	int h = SCREENHEIGHT;

	ReleaseScreenshotBuffer();
	ScreenshotBuffer = new BYTE[w * h * 3];

	float rcpWidth = 1.0f / w;
	float rcpHeight = 1.0f / h;
	for (int y = 0; y < h; y++)
	{
		for (int x = 0; x < w; x++)
		{
			float u = (x + 0.5f) * rcpWidth;
			float v = (y + 0.5f) * rcpHeight;
			int sx = u * viewport.width;
			int sy = v * viewport.height;
			int sindex = (sx + sy * viewport.width) * 3;
			int dindex = (x + y * w) * 3;
			ScreenshotBuffer[dindex] = pixels[sindex];
			ScreenshotBuffer[dindex + 1] = pixels[sindex + 1];
			ScreenshotBuffer[dindex + 2] = pixels[sindex + 2];
		}
	}

	pitch = -w*3;
	color_type = SS_RGB;
	buffer = ScreenshotBuffer + w * 3 * (h - 1);
}